

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

void __thiscall
spoa::Graph::AddAlignment
          (Graph *this,Alignment *alignment,char *sequence,uint32_t sequence_len,char *quality,
          uint32_t quality_len)

{
  ulong uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> weights;
  uint local_5c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  Alignment *local_40;
  char *local_38;
  
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_40 = alignment;
  local_38 = sequence;
  if (quality_len != 0) {
    uVar1 = 0;
    do {
      local_5c = (int)quality[uVar1] - 0x21;
      if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<int>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_5c);
      }
      else {
        *local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = local_5c;
        local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar1 = uVar1 + 1;
    } while (quality_len != uVar1);
  }
  AddAlignment(this,local_40,local_38,sequence_len,&local_58);
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Graph::AddAlignment(
    const Alignment& alignment,
    const char* sequence, std::uint32_t sequence_len,
    const char* quality, std::uint32_t quality_len) {
  std::vector<std::uint32_t> weights;
  for (std::uint32_t i = 0; i < quality_len; ++i) {
    weights.emplace_back(quality[i] - 33);  // Phred quality
  }
  AddAlignment(alignment, sequence, sequence_len, weights);
}